

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::SetupDescriptorScriptPubKeyMans(CWallet *this)

{
  long lVar1;
  pointer pUVar2;
  uint256 id_00;
  bool bVar3;
  OutputType type;
  WalletDatabase *pWVar4;
  UniValue *pUVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  reference pvVar7;
  uint extraout_var;
  ExternalSignerScriptPubKeyMan *this_00;
  runtime_error *prVar8;
  char *pcVar9;
  long lVar10;
  pointer pUVar11;
  long in_FS_OFFSET;
  Span<const_std::byte> seed_00;
  string_view key;
  ExternalSignerScriptPubKeyMan *local_330;
  Descriptor *local_328;
  allocator<char> local_319;
  vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
  descs;
  WalletBatch local_300;
  undefined2 local_2ea;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  uint256 id;
  CPubKey seed;
  _Rb_tree_node_base local_1b8;
  size_t local_198;
  _Rb_tree_node_base local_188;
  size_t local_168;
  _Rb_tree_node_base local_158;
  size_t local_138;
  string desc_error;
  CKey seed_key;
  CExtKey master_key;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x23 & 1) == 0) {
    GenerateRandomKey(SUB81(&seed_key,0));
    CKey::GetPubKey(&seed,&seed_key);
    bVar3 = CKey::VerifyPubKey(&seed_key,&seed);
    if (!bVar3) {
      __assert_fail("seed_key.VerifyPubKey(seed)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0xead,"void wallet::CWallet::SetupDescriptorScriptPubKeyMans()");
    }
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    master_key.chaincode.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    master_key.key.fCompressed = false;
    master_key.key.keydata._M_t.
    super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
          )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
            )0x0;
    seed_00.m_size._0_4_ =
         (uint)((__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 )seed_key.keydata._M_t.
                  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl !=
               (__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                )0x0) << 5;
    seed_00.m_data =
         (byte *)seed_key.keydata._M_t.
                 super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                 .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl;
    seed_00.m_size._4_4_ = 0;
    CExtKey::SetSeed(&master_key,seed_00);
    SetupDescriptorScriptPubKeyMans(this,&master_key);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&master_key.key.keydata);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr(&seed_key.keydata);
LAB_0099e13e:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    ExternalSignerScriptPubKeyMan::GetExternalSigner();
    ExternalSigner::GetDescriptors((UniValue *)&seed_key,(ExternalSigner *)&master_key,0);
    if (seed_key._0_4_ != 1) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&desc_error,"SetupDescriptorScriptPubKeyMans",(allocator<char> *)&id);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&seed,
                     &desc_error,": Unexpected result");
      std::runtime_error::runtime_error(prVar8,(string *)&seed);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_0099e698;
    }
    pWVar4 = GetDatabase(this);
    (*pWVar4->_vptr_WalletDatabase[0xe])(&local_300,pWVar4,1);
    local_300.m_database = pWVar4;
    bVar3 = WalletBatch::TxnBegin(&local_300);
    if (bVar3) {
      local_2ea = 0x100;
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        bVar3 = *(bool *)((long)&local_2ea + lVar10);
        pcVar9 = "receive";
        if ((ulong)bVar3 != 0) {
          pcVar9 = "internal";
        }
        key._M_str = pcVar9;
        key._M_len = (ulong)bVar3 + 7;
        pUVar5 = UniValue::find_value((UniValue *)&seed_key,key);
        if (pUVar5->typ != VARR) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&desc_error,"SetupDescriptorScriptPubKeyMans",(allocator<char> *)&id)
          ;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&seed,
                         &desc_error,": Unexpected result");
          std::runtime_error::runtime_error(prVar8,(string *)&seed);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_0099e698;
        }
        pUVar5 = UniValue::get_array(pUVar5);
        pvVar6 = UniValue::getValues(pUVar5);
        pUVar11 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pUVar2 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        while( true ) {
          if (pUVar11 == pUVar2) break;
          seed.vch._0_8_ = &PTR__FlatSigningProvider_01158e68;
          seed.vch[0x10] = '\0';
          seed.vch[0x11] = '\0';
          seed.vch[0x12] = '\0';
          seed.vch[0x13] = '\0';
          seed.vch[0x18] = '\0';
          seed.vch[0x19] = '\0';
          seed.vch[0x1a] = '\0';
          seed.vch[0x1b] = '\0';
          seed.vch[0x1c] = '\0';
          seed.vch[0x1d] = '\0';
          seed.vch[0x1e] = '\0';
          seed.vch[0x1f] = '\0';
          seed.vch._32_8_ = seed.vch + 0x10;
          seed.vch[0x30] = '\0';
          seed.vch[0x31] = '\0';
          seed.vch[0x32] = '\0';
          seed.vch[0x33] = '\0';
          seed.vch[0x34] = '\0';
          seed.vch[0x35] = '\0';
          seed.vch[0x36] = '\0';
          seed.vch[0x37] = '\0';
          stack0xfffffffffffffe18 = _S_red;
          local_1b8._M_color = _S_red;
          local_1b8._M_parent = (_Base_ptr)0x0;
          local_1b8._M_left = &local_1b8;
          local_198 = 0;
          local_188._M_color = _S_red;
          local_188._M_parent = (_Base_ptr)0x0;
          local_188._M_left = &local_188;
          local_168 = 0;
          local_158._M_color = _S_red;
          local_158._M_parent = (_Base_ptr)0x0;
          local_158._M_left = &local_158;
          local_138 = 0;
          desc_error._M_dataplus._M_p = (pointer)&desc_error.field_2;
          desc_error._M_string_length = 0;
          desc_error.field_2._M_local_buf[0] = '\0';
          seed.vch._40_8_ = seed.vch._32_8_;
          local_1b8._M_right = local_1b8._M_left;
          local_188._M_right = local_188._M_left;
          local_158._M_right = local_158._M_left;
          Parse(&descs,&pUVar11->val,(FlatSigningProvider *)&seed,&desc_error,false);
          if (descs.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              descs.
              super__Vector_base<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2e8,"SetupDescriptorScriptPubKeyMans",&local_319);
            std::operator+(&local_2c8,&local_2e8,": Invalid descriptor \"");
            std::operator+(&local_2a8,&local_2c8,&pUVar11->val);
            std::operator+(&local_288,&local_2a8,"\" (");
            std::operator+(&local_268,&local_288,&desc_error);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                           &local_268,")");
            std::runtime_error::runtime_error(prVar8,(string *)&id);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_0099e698;
          }
          pvVar7 = std::
                   vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
                   ::at(&descs,0);
          (*((pvVar7->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t
             .super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
             super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl)->_vptr_Descriptor[0xb])();
          if ((extraout_var & 1) != 0) {
            type = (*((pvVar7->_M_t).
                      super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                      super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                      super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl)->_vptr_Descriptor
                     [0xb])();
            this_00 = (ExternalSignerScriptPubKeyMan *)operator_new(0x278);
            ExternalSignerScriptPubKeyMan::ExternalSignerScriptPubKeyMan
                      (this_00,&this->super_WalletStorage,this->m_keypool_size);
            local_328 = (pvVar7->_M_t).
                        super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
                        super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
                        super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl;
            (pvVar7->_M_t).super___uniq_ptr_impl<Descriptor,_std::default_delete<Descriptor>_>._M_t.
            super__Tuple_impl<0UL,_Descriptor_*,_std::default_delete<Descriptor>_>.
            super__Head_base<0UL,_Descriptor_*,_false>._M_head_impl = (Descriptor *)0x0;
            ExternalSignerScriptPubKeyMan::SetupDescriptor
                      (this_00,&local_300,
                       (unique_ptr<Descriptor,_std::default_delete<Descriptor>_>)&local_328);
            if (local_328 != (Descriptor *)0x0) {
              (*local_328->_vptr_Descriptor[1])();
            }
            local_328 = (Descriptor *)0x0;
            (*(this_00->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan
              [0x1a])(&id,this_00);
            local_330 = this_00;
            AddScriptPubKeyMan(this,&id,(unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                                         )&local_330);
            if (local_330 != (ExternalSignerScriptPubKeyMan *)0x0) {
              (*(local_330->super_DescriptorScriptPubKeyMan).super_ScriptPubKeyMan.
                _vptr_ScriptPubKeyMan[1])();
            }
            local_330 = (ExternalSignerScriptPubKeyMan *)0x0;
            id_00.super_base_blob<256U>.m_data._M_elems[8] =
                 id.super_base_blob<256U>.m_data._M_elems[8];
            id_00.super_base_blob<256U>.m_data._M_elems[9] =
                 id.super_base_blob<256U>.m_data._M_elems[9];
            id_00.super_base_blob<256U>.m_data._M_elems[10] =
                 id.super_base_blob<256U>.m_data._M_elems[10];
            id_00.super_base_blob<256U>.m_data._M_elems[0xb] =
                 id.super_base_blob<256U>.m_data._M_elems[0xb];
            id_00.super_base_blob<256U>.m_data._M_elems[0xc] =
                 id.super_base_blob<256U>.m_data._M_elems[0xc];
            id_00.super_base_blob<256U>.m_data._M_elems[0xd] =
                 id.super_base_blob<256U>.m_data._M_elems[0xd];
            id_00.super_base_blob<256U>.m_data._M_elems[0xe] =
                 id.super_base_blob<256U>.m_data._M_elems[0xe];
            id_00.super_base_blob<256U>.m_data._M_elems[0xf] =
                 id.super_base_blob<256U>.m_data._M_elems[0xf];
            id_00.super_base_blob<256U>.m_data._M_elems[0] =
                 id.super_base_blob<256U>.m_data._M_elems[0];
            id_00.super_base_blob<256U>.m_data._M_elems[1] =
                 id.super_base_blob<256U>.m_data._M_elems[1];
            id_00.super_base_blob<256U>.m_data._M_elems[2] =
                 id.super_base_blob<256U>.m_data._M_elems[2];
            id_00.super_base_blob<256U>.m_data._M_elems[3] =
                 id.super_base_blob<256U>.m_data._M_elems[3];
            id_00.super_base_blob<256U>.m_data._M_elems[4] =
                 id.super_base_blob<256U>.m_data._M_elems[4];
            id_00.super_base_blob<256U>.m_data._M_elems[5] =
                 id.super_base_blob<256U>.m_data._M_elems[5];
            id_00.super_base_blob<256U>.m_data._M_elems[6] =
                 id.super_base_blob<256U>.m_data._M_elems[6];
            id_00.super_base_blob<256U>.m_data._M_elems[7] =
                 id.super_base_blob<256U>.m_data._M_elems[7];
            id_00.super_base_blob<256U>.m_data._M_elems[0x10] =
                 id.super_base_blob<256U>.m_data._M_elems[0x10];
            id_00.super_base_blob<256U>.m_data._M_elems[0x11] =
                 id.super_base_blob<256U>.m_data._M_elems[0x11];
            id_00.super_base_blob<256U>.m_data._M_elems[0x12] =
                 id.super_base_blob<256U>.m_data._M_elems[0x12];
            id_00.super_base_blob<256U>.m_data._M_elems[0x13] =
                 id.super_base_blob<256U>.m_data._M_elems[0x13];
            id_00.super_base_blob<256U>.m_data._M_elems[0x14] =
                 id.super_base_blob<256U>.m_data._M_elems[0x14];
            id_00.super_base_blob<256U>.m_data._M_elems[0x15] =
                 id.super_base_blob<256U>.m_data._M_elems[0x15];
            id_00.super_base_blob<256U>.m_data._M_elems[0x16] =
                 id.super_base_blob<256U>.m_data._M_elems[0x16];
            id_00.super_base_blob<256U>.m_data._M_elems[0x17] =
                 id.super_base_blob<256U>.m_data._M_elems[0x17];
            id_00.super_base_blob<256U>.m_data._M_elems[0x18] =
                 id.super_base_blob<256U>.m_data._M_elems[0x18];
            id_00.super_base_blob<256U>.m_data._M_elems[0x19] =
                 id.super_base_blob<256U>.m_data._M_elems[0x19];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1a] =
                 id.super_base_blob<256U>.m_data._M_elems[0x1a];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1b] =
                 id.super_base_blob<256U>.m_data._M_elems[0x1b];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1c] =
                 id.super_base_blob<256U>.m_data._M_elems[0x1c];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1d] =
                 id.super_base_blob<256U>.m_data._M_elems[0x1d];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1e] =
                 id.super_base_blob<256U>.m_data._M_elems[0x1e];
            id_00.super_base_blob<256U>.m_data._M_elems[0x1f] =
                 id.super_base_blob<256U>.m_data._M_elems[0x1f];
            AddActiveScriptPubKeyManWithDb(this,&local_300,id_00,type,bVar3);
          }
          std::
          vector<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>,_std::allocator<std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>_>_>
          ::~vector(&descs);
          std::__cxx11::string::~string((string *)&desc_error);
          FlatSigningProvider::~FlatSigningProvider((FlatSigningProvider *)&seed);
          pUVar11 = pUVar11 + 1;
        }
      }
      bVar3 = WalletBatch::TxnCommit(&local_300);
      if (bVar3) {
        if ((tuple<wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>)
            local_300.m_batch._M_t.
            super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
            ._M_t.
            super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
            .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
            (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
          (*(*(_func_int ***)
              local_300.m_batch._M_t.
              super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
              ._M_t.
              super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
              .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
        }
        UniValue::~UniValue((UniValue *)&seed_key);
        ExternalSigner::~ExternalSigner((ExternalSigner *)&master_key);
        goto LAB_0099e13e;
      }
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar8,"Error: cannot commit db transaction for descriptors import");
    }
    else {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar8,"Error: cannot create db transaction for descriptors import");
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_0099e698:
  __stack_chk_fail();
}

Assistant:

void CWallet::SetupDescriptorScriptPubKeyMans()
{
    AssertLockHeld(cs_wallet);

    if (!IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
        // Make a seed
        CKey seed_key = GenerateRandomKey();
        CPubKey seed = seed_key.GetPubKey();
        assert(seed_key.VerifyPubKey(seed));

        // Get the extended key
        CExtKey master_key;
        master_key.SetSeed(seed_key);

        SetupDescriptorScriptPubKeyMans(master_key);
    } else {
        ExternalSigner signer = ExternalSignerScriptPubKeyMan::GetExternalSigner();

        // TODO: add account parameter
        int account = 0;
        UniValue signer_res = signer.GetDescriptors(account);

        if (!signer_res.isObject()) throw std::runtime_error(std::string(__func__) + ": Unexpected result");

        WalletBatch batch(GetDatabase());
        if (!batch.TxnBegin()) throw std::runtime_error("Error: cannot create db transaction for descriptors import");

        for (bool internal : {false, true}) {
            const UniValue& descriptor_vals = signer_res.find_value(internal ? "internal" : "receive");
            if (!descriptor_vals.isArray()) throw std::runtime_error(std::string(__func__) + ": Unexpected result");
            for (const UniValue& desc_val : descriptor_vals.get_array().getValues()) {
                const std::string& desc_str = desc_val.getValStr();
                FlatSigningProvider keys;
                std::string desc_error;
                auto descs = Parse(desc_str, keys, desc_error, false);
                if (descs.empty()) {
                    throw std::runtime_error(std::string(__func__) + ": Invalid descriptor \"" + desc_str + "\" (" + desc_error + ")");
                }
                auto& desc = descs.at(0);
                if (!desc->GetOutputType()) {
                    continue;
                }
                OutputType t =  *desc->GetOutputType();
                auto spk_manager = std::unique_ptr<ExternalSignerScriptPubKeyMan>(new ExternalSignerScriptPubKeyMan(*this, m_keypool_size));
                spk_manager->SetupDescriptor(batch, std::move(desc));
                uint256 id = spk_manager->GetID();
                AddScriptPubKeyMan(id, std::move(spk_manager));
                AddActiveScriptPubKeyManWithDb(batch, id, t, internal);
            }
        }

        // Ensure imported descriptors are committed to disk
        if (!batch.TxnCommit()) throw std::runtime_error("Error: cannot commit db transaction for descriptors import");
    }
}